

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O3

void check_secfrac_convert(void)

{
  uint64_t secfracs;
  uint64_t uVar1;
  long lVar2;
  float b;
  anon_struct_16_2_01c60da5 testvals [4];
  char teststr_s2f [30];
  char teststr_f2s [30];
  float afStack_b0 [2];
  uint64_t local_a8 [8];
  char local_68 [32];
  char local_48 [40];
  
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0x3efae148;
  local_a8[3] = 0x7d70a400;
  local_a8[4] = 0x3f000000;
  local_a8[5] = 0x80000000;
  local_a8[6] = 0x3f7fff58;
  local_a8[7] = 0xffff5800;
  builtin_strncpy(local_48 + 0x10,"t -> secfracs",0xe);
  builtin_strncpy(local_48,"testvals 0, floa",0x10);
  builtin_strncpy(local_68 + 0x10,"racs -> float",0xe);
  builtin_strncpy(local_68,"testvals 0, secf",0x10);
  lVar2 = 8;
  do {
    local_48[9] = local_48[9] + '\x01';
    local_68[9] = local_68[9] + '\x01';
    afStack_b0[1] = *(float *)((long)afStack_b0 + lVar2);
    uVar1 = rtosc_float2secfracs(afStack_b0[1]);
    secfracs = *(uint64_t *)((long)local_a8 + lVar2);
    assert_true((uint)(secfracs == uVar1),local_48,0x17);
    b = rtosc_secfracs2float(secfracs);
    assert_f32_eq(afStack_b0[1],b,local_68,0x19);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x48);
  return;
}

Assistant:

void check_secfrac_convert()
{
    struct
    {
        float    f;
        uint64_t secfracs;
    } testvals[] = { { 0.f,   0 },          /* 0 secfracs is always 0 */
                     { 0.49f, 2104534016},  /* 0.49 ~ max(signed int) */
                     { 0.5f,  2147483648},
                     { 0.99999f, 4294924288} };      /* 0.99 ~ max(unsigned int) */

    char teststr_f2s[] = "testvals 0, float -> secfracs";
    char teststr_s2f[] = "testvals 0, secfracs -> float";
    for(size_t i = 0; i < sizeof(testvals)/sizeof(testvals[0]); ++i)
    {
        teststr_f2s[9]++;
        teststr_s2f[9]++;
        uint64_t secfracs = rtosc_float2secfracs(testvals[i].f);
        assert_true(testvals[i].secfracs == secfracs, teststr_f2s, __LINE__);
        float f = rtosc_secfracs2float(testvals[i].secfracs);
        assert_f32_eq(testvals[i].f, f, teststr_s2f, __LINE__);
    }
}